

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pi.c
# Opt level: O1

void opj_pi_update_encoding_parameters(opj_image_t *p_image,opj_cp_t *p_cp,OPJ_UINT32 p_tile_no)

{
  uint uVar1;
  OPJ_UINT32 p_num_comps;
  uint p_tx0;
  int iVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  uint p_tx1;
  uint p_max_prec;
  int iVar10;
  long lVar11;
  ulong uVar12;
  uint uVar13;
  int iVar14;
  opj_image_comp_t *poVar15;
  OPJ_UINT32 OVar16;
  uint uVar17;
  opj_tccp_t *poVar18;
  long lVar19;
  int iVar20;
  uint p_dx_min;
  long lVar21;
  int iVar22;
  uint uVar23;
  OPJ_UINT32 in_stack_ffffffffffffff10;
  
  if (p_cp == (opj_cp_t *)0x0) {
    __assert_fail("p_cp != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/pi.c"
                  ,0x804,
                  "void opj_pi_update_encoding_parameters(const opj_image_t *, opj_cp_t *, OPJ_UINT32)"
                 );
  }
  if (p_image == (opj_image_t *)0x0) {
    __assert_fail("p_image != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/pi.c"
                  ,0x805,
                  "void opj_pi_update_encoding_parameters(const opj_image_t *, opj_cp_t *, OPJ_UINT32)"
                 );
  }
  uVar1 = p_cp->tw;
  if (p_cp->th * uVar1 <= p_tile_no) {
    __assert_fail("p_tile_no < p_cp->tw * p_cp->th",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/pi.c"
                  ,0x806,
                  "void opj_pi_update_encoding_parameters(const opj_image_t *, opj_cp_t *, OPJ_UINT32)"
                 );
  }
  p_max_prec = 0;
  uVar6 = p_cp->tdx;
  uVar9 = (p_tile_no % uVar1) * uVar6 + p_cp->tx0;
  uVar23 = p_cp->tdy;
  p_tx0 = p_image->x0;
  if (p_image->x0 < uVar9) {
    p_tx0 = uVar9;
  }
  p_tx1 = uVar9 + uVar6;
  if (CARRY4(uVar9,uVar6)) {
    p_tx1 = 0xffffffff;
  }
  if (p_image->x1 <= p_tx1) {
    p_tx1 = p_image->x1;
  }
  uVar6 = (p_tile_no / uVar1) * uVar23 + p_cp->ty0;
  uVar1 = p_image->y0;
  if (p_image->y0 < uVar6) {
    uVar1 = uVar6;
  }
  uVar9 = uVar6 + uVar23;
  if (CARRY4(uVar6,uVar23)) {
    uVar9 = 0xffffffff;
  }
  if (p_image->y1 <= uVar9) {
    uVar9 = p_image->y1;
  }
  p_num_comps = p_image->numcomps;
  if (p_num_comps == 0) {
    uVar23 = 0x7fffffff;
    uVar6 = 0;
    p_dx_min = 0x7fffffff;
  }
  else {
    poVar18 = p_cp->tcps[p_tile_no].tccps;
    poVar15 = p_image->comps;
    uVar23 = 0x7fffffff;
    p_max_prec = 0;
    uVar6 = 0;
    p_dx_min = 0x7fffffff;
    OVar16 = 0;
    do {
      lVar21 = (long)(int)poVar15->dx;
      if (lVar21 == 0) {
LAB_00123b95:
        __assert_fail("b",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/opj_intmath.h"
                      ,0xa2,"OPJ_INT32 opj_int_ceildiv(OPJ_INT32, OPJ_INT32)");
      }
      lVar11 = (long)(int)poVar15->dy;
      if (lVar11 == 0) goto LAB_00123b95;
      uVar7 = poVar18->numresolutions;
      uVar8 = (ulong)uVar7;
      if (uVar6 < uVar7) {
        uVar6 = uVar7;
      }
      if (uVar8 != 0) {
        lVar19 = 0;
        do {
          uVar7 = uVar7 - 1;
          bVar3 = (byte)uVar7;
          bVar4 = (byte)*(undefined4 *)((long)poVar18->prcw + lVar19);
          uVar13 = poVar15->dx << (bVar3 + bVar4 & 0x1f);
          bVar5 = (byte)*(undefined4 *)((long)poVar18->prch + lVar19);
          uVar17 = poVar15->dy << (bVar3 + bVar5 & 0x1f);
          if (uVar13 <= uVar23) {
            uVar23 = uVar13;
          }
          if (uVar17 <= p_dx_min) {
            p_dx_min = uVar17;
          }
          uVar12 = -1L << (bVar3 & 0x3f) ^ 0xffffffffffffffff;
          iVar20 = (int)((long)((long)(int)(((int)p_tx0 + lVar21 + -1) / lVar21) + uVar12) >>
                        (bVar3 & 0x3f));
          iVar14 = (int)((long)((long)(int)(((int)uVar1 + lVar11 + -1) / lVar11) + uVar12) >>
                        (bVar3 & 0x3f));
          iVar22 = (int)((long)((long)(int)((lVar21 + -1 + (long)(int)p_tx1) / lVar21) + uVar12) >>
                        (bVar3 & 0x3f));
          iVar10 = (int)((long)(uVar12 + (long)(int)(((int)uVar9 + lVar11 + -1) / lVar11)) >>
                        (bVar3 & 0x3f));
          iVar2 = ((int)(~(-1L << (bVar4 & 0x3f)) + (long)iVar22 >> (bVar4 & 0x3f)) -
                   (iVar20 >> (bVar4 & 0x1f)) << (bVar4 & 0x1f)) >> (bVar4 & 0x1f);
          if (iVar20 == iVar22) {
            iVar2 = 0;
          }
          iVar22 = ((int)(~(-1L << (bVar5 & 0x3f)) + (long)iVar10 >> (bVar5 & 0x3f)) -
                    (iVar14 >> (bVar5 & 0x1f)) << (bVar5 & 0x1f)) >> (bVar5 & 0x1f);
          if (iVar14 == iVar10) {
            iVar22 = 0;
          }
          uVar13 = iVar22 * iVar2;
          if ((uint)(iVar22 * iVar2) <= p_max_prec) {
            uVar13 = p_max_prec;
          }
          p_max_prec = uVar13;
          lVar19 = lVar19 + 4;
        } while (uVar8 << 2 != lVar19);
      }
      poVar15 = poVar15 + 1;
      poVar18 = poVar18 + 1;
      OVar16 = OVar16 + 1;
    } while (OVar16 != p_num_comps);
  }
  if ((p_cp->tcps[p_tile_no].field_0x1638 & 4) == 0) {
    opj_pi_update_encode_not_poc
              (p_cp,p_num_comps,p_tile_no,p_tx0,p_tx1,uVar1,uVar9,p_max_prec,uVar6,uVar23,p_dx_min);
  }
  else {
    opj_pi_update_encode_poc_and_final
              (p_cp,p_tile_no,p_tx0,p_tx1,uVar1,uVar9,p_max_prec,uVar23,p_dx_min,
               in_stack_ffffffffffffff10);
  }
  return;
}

Assistant:

void opj_pi_update_encoding_parameters(const opj_image_t *p_image,
                                       opj_cp_t *p_cp,
                                       OPJ_UINT32 p_tile_no)
{
    /* encoding parameters to set */
    OPJ_UINT32 l_max_res;
    OPJ_UINT32 l_max_prec;
    OPJ_INT32 l_tx0, l_tx1, l_ty0, l_ty1;
    OPJ_UINT32 l_dx_min, l_dy_min;

    /* pointers */
    opj_tcp_t *l_tcp = 00;

    /* preconditions */
    assert(p_cp != 00);
    assert(p_image != 00);
    assert(p_tile_no < p_cp->tw * p_cp->th);

    l_tcp = &(p_cp->tcps[p_tile_no]);

    /* get encoding parameters */
    opj_get_encoding_parameters(p_image, p_cp, p_tile_no, &l_tx0, &l_tx1, &l_ty0,
                                &l_ty1, &l_dx_min, &l_dy_min, &l_max_prec, &l_max_res);

    if (l_tcp->POC) {
        opj_pi_update_encode_poc_and_final(p_cp, p_tile_no, l_tx0, l_tx1, l_ty0, l_ty1,
                                           l_max_prec, l_max_res, l_dx_min, l_dy_min);
    } else {
        opj_pi_update_encode_not_poc(p_cp, p_image->numcomps, p_tile_no, l_tx0, l_tx1,
                                     l_ty0, l_ty1, l_max_prec, l_max_res, l_dx_min, l_dy_min);
    }
}